

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::yarn4>(yarn4 *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  string res;
  string local_58;
  double local_38;
  
  lVar6 = std::chrono::_V2::system_clock::now();
  iVar1 = (r->P).a[0];
  iVar2 = (r->P).a[1];
  iVar3 = (r->P).a[2];
  iVar4 = (r->P).a[3];
  uVar9 = (ulong)(uint)(r->S).r[0];
  iVar7 = 0;
  lVar11 = 0x1000000;
  iVar14 = (r->S).r[1];
  iVar13 = (r->S).r[2];
  iVar15 = (r->S).r[3];
  do {
    iVar8 = iVar13;
    iVar13 = iVar14;
    iVar14 = (int)uVar9;
    (r->S).r[3] = iVar8;
    (r->S).r[2] = iVar13;
    uVar9 = (long)iVar15 * (long)iVar4 + (long)iVar8 * (long)iVar3 +
            (long)iVar13 * (long)iVar2 + (long)iVar14 * (long)iVar1;
    uVar10 = (uVar9 >> 0x1f) + (uVar9 & 0x7fffffff);
    uVar9 = uVar10 - 0x1fffffffc;
    if ((uint)(uVar10 >> 2) < 0x7fffffff) {
      uVar9 = uVar10;
    }
    uVar10 = uVar9 - 0xfffffffe;
    if (uVar9 < 0xfffffffe) {
      uVar10 = uVar9;
    }
    uVar9 = uVar10 + 0x80000001;
    if (uVar10 < 0x7fffffff) {
      uVar9 = uVar10;
    }
    (r->S).r[1] = iVar14;
    iVar15 = (int)uVar9;
    (r->S).r[0] = iVar15;
    uVar5 = 0;
    if (iVar15 != 0) {
      uVar5 = (uint)((ulong)*(uint *)(trng::yarn4::g + (uVar9 & 0xffff) * 4) *
                    (ulong)*(uint *)(trng::yarn4::g + (long)(iVar15 >> 0x10) * 4 + 0x40000)) &
              0x7fffffff;
      iVar15 = (int)((ulong)*(uint *)(trng::yarn4::g + (uVar9 & 0xffff) * 4) *
                     (ulong)*(uint *)(trng::yarn4::g + (long)(iVar15 >> 0x10) * 4 + 0x40000) >> 0x1f
                    );
      uVar12 = uVar5 + iVar15;
      uVar5 = uVar5 + 0x80000001 + iVar15;
      if (uVar12 < 0x7fffffff) {
        uVar5 = uVar12;
      }
    }
    iVar7 = iVar7 + uVar5;
    lVar11 = lVar11 + -1;
    iVar15 = iVar8;
  } while (lVar11 != 0);
  lVar11 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar11 - lVar6) / 1000) * 1e-06);
  to_string<double>(&local_58,&local_38);
  while (local_58._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar7;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}